

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_queue_examples.cpp
# Opt level: O0

void density_tests::
     SpQueueSamples<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0>::
     spinlocking_heterogeneous_queue_reentrant_try_put_samples(void)

{
  bool bVar1;
  int *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  reentrant_put_transaction<void> put_4;
  runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type_5;
  string source_3;
  sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  queue_6;
  reentrant_put_transaction<void> put_3;
  runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type_4;
  string source_2;
  sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  queue_5;
  reentrant_put_transaction<void> put_2;
  runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type_3;
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  queue_4;
  runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type_2;
  string source_1;
  sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  queue_3;
  runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type_1;
  string source;
  sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  queue_2;
  runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type;
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  queue_1;
  reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  put_1;
  reentrant_put_transaction<int> put;
  SpQueue queue;
  reentrant_put_transaction<void> local_730;
  reentrant_put_transaction<void> local_710;
  runtime_type local_6f0;
  allocator local_6e1;
  string local_6e0 [32];
  sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_6c0;
  reentrant_put_transaction<void> local_630;
  reentrant_put_transaction<void> local_610;
  runtime_type local_5f0;
  allocator local_5e1;
  string local_5e0 [32];
  sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_5c0;
  reentrant_put_transaction<void> local_508;
  reentrant_put_transaction<void> local_4e8;
  runtime_type local_4c8;
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_4c0;
  runtime_type local_430;
  allocator local_421;
  string local_420 [32];
  sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_400;
  runtime_type local_370;
  allocator local_361;
  string local_360 [32];
  sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_340;
  runtime_type local_288;
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_280;
  char local_1d5;
  int local_1d4;
  reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  int local_18c;
  reentrant_put_transaction<int> local_188;
  reentrant_put_transaction<int> local_168;
  char local_141;
  int local_140 [5];
  allocator local_129;
  string local_128 [36];
  int local_104;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  local_100;
  
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::sp_heter_queue(&local_100);
  local_104 = 0xc;
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
          ::try_reentrant_push<int>(&local_100,progress_blocking,&local_104);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"Hello world!!",&local_129);
    density::
    sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
    ::try_reentrant_push<std::__cxx11::string>
              ((sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
                *)&local_100,progress_blocking,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
  }
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
          ::try_reentrant_emplace<int>(&local_100,progress_blocking);
  if (bVar1) {
    local_140[0] = 0xc;
    local_141 = '-';
    density::
    sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
    ::try_reentrant_emplace<std::__cxx11::string,int,char>
              ((sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
                *)&local_100,progress_blocking,local_140,&local_141);
  }
  local_18c = 0xc;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::try_start_reentrant_push<int>(&local_188,&local_100,progress_blocking,&local_18c);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::reentrant_put_transaction<int>::reentrant_put_transaction<int,void>
            ((reentrant_put_transaction<int> *)&local_168,&local_188);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_188);
  bVar1 = density::sp_heter_queue::reentrant_put_transaction::operator_cast_to_bool
                    ((reentrant_put_transaction *)&local_168);
  if (bVar1) {
    piVar2 = density::
             sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
             ::reentrant_put_transaction<int>::element<int,_nullptr>(&local_168);
    *piVar2 = *piVar2 + 2;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::reentrant_put_transaction<int>::commit(&local_168);
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_168);
  local_1d4 = 4;
  local_1d5 = '*';
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::try_start_reentrant_emplace<std::__cxx11::string,int,char>
            (&local_1d0,
             (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
              *)&local_100,progress_blocking,&local_1d4,&local_1d5);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::reentrant_put_transaction<std::__cxx11::string>::
  reentrant_put_transaction<std::__cxx11::string,void>
            ((reentrant_put_transaction<std::__cxx11::string> *)&local_1b0,&local_1d0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::
  reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~reentrant_put_transaction(&local_1d0);
  bVar1 = density::sp_heter_queue::reentrant_put_transaction::operator_cast_to_bool
                    ((reentrant_put_transaction *)&local_1b0);
  if (bVar1) {
    this = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
           ::
           reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::
           element<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                     (&local_1b0);
    std::__cxx11::string::operator+=((string *)this,"****");
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::
    reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::commit(&local_1b0);
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::
  reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~reentrant_put_transaction(&local_1b0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::~sp_heter_queue(&local_100);
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_280);
  local_288.m_feature_table =
       (tuple_type *)
       density::
       runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
       ::make<int>();
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_reentrant_dyn_push(&local_280,progress_blocking,&local_288);
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_280);
  density::
  sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_340);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"Hello world!!",&local_361);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  local_370.m_feature_table =
       (tuple_type *)
       density::
       runtime_type<density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>
       ::make<std::__cxx11::string_const>();
  density::
  sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_reentrant_dyn_push_copy(&local_340,progress_blocking,&local_370,local_360);
  std::__cxx11::string::~string(local_360);
  density::
  sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_340);
  density::
  sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_400);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"Hello world!!",&local_421);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  local_430.m_feature_table =
       (tuple_type *)
       density::
       runtime_type<density::f_move_construct,density::f_destroy,density::f_size,density::f_alignment>
       ::make<std::__cxx11::string>();
  density::
  sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_reentrant_dyn_push_move(&local_400,progress_blocking,&local_430,local_420);
  std::__cxx11::string::~string(local_420);
  density::
  sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_400);
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_4c0);
  local_4c8.m_feature_table =
       (tuple_type *)
       density::
       runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
       ::make<int>();
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_start_reentrant_dyn_push(&local_508,&local_4c0,progress_blocking,&local_4c8);
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::reentrant_put_transaction<void>::reentrant_put_transaction<void,void>
            ((reentrant_put_transaction<void> *)&local_4e8,&local_508);
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::~reentrant_put_transaction(&local_508);
  bVar1 = density::sp_heter_queue::reentrant_put_transaction::operator_cast_to_bool
                    ((reentrant_put_transaction *)&local_4e8);
  if (bVar1) {
    density::
    sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<void>::commit(&local_4e8);
  }
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::~reentrant_put_transaction(&local_4e8);
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_4c0);
  density::
  sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_5c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e0,"Hello world!!",&local_5e1);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  local_5f0.m_feature_table =
       (tuple_type *)
       density::
       runtime_type<density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>
       ::make<std::__cxx11::string_const>();
  density::
  sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_start_reentrant_dyn_push_copy(&local_630,&local_5c0,progress_blocking,&local_5f0,local_5e0);
  density::
  sp_heter_queue<density::runtime_type<density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::reentrant_put_transaction<void>::reentrant_put_transaction<void,void>
            ((reentrant_put_transaction<void> *)&local_610,&local_630);
  density::
  sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::~reentrant_put_transaction(&local_630);
  bVar1 = density::sp_heter_queue::reentrant_put_transaction::operator_cast_to_bool
                    ((reentrant_put_transaction *)&local_610);
  if (bVar1) {
    density::
    sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<void>::commit(&local_610);
  }
  density::
  sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::~reentrant_put_transaction(&local_610);
  std::__cxx11::string::~string(local_5e0);
  density::
  sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_5c0);
  density::
  sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_6c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6e0,"Hello world!!",&local_6e1);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
  local_6f0.m_feature_table =
       (tuple_type *)
       density::
       runtime_type<density::f_move_construct,density::f_destroy,density::f_size,density::f_alignment>
       ::make<std::__cxx11::string>();
  density::
  sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_start_reentrant_dyn_push_move(&local_730,&local_6c0,progress_blocking,&local_6f0,local_6e0);
  density::
  sp_heter_queue<density::runtime_type<density::f_move_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::reentrant_put_transaction<void>::reentrant_put_transaction<void,void>
            ((reentrant_put_transaction<void> *)&local_710,&local_730);
  density::
  sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::~reentrant_put_transaction(&local_730);
  bVar1 = density::sp_heter_queue::reentrant_put_transaction::operator_cast_to_bool
                    ((reentrant_put_transaction *)&local_710);
  if (bVar1) {
    density::
    sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<void>::commit(&local_710);
  }
  density::
  sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::~reentrant_put_transaction(&local_710);
  std::__cxx11::string::~string(local_6e0);
  density::
  sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_6c0);
  return;
}

Assistant:

static void spinlocking_heterogeneous_queue_reentrant_try_put_samples()
{
    using namespace density;

    {
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        //! [sp_heter_queue try_reentrant_push example 1]
        if (queue.try_reentrant_push(progress_blocking, 12))
        {
            if (queue.try_reentrant_push(progress_blocking, std::string("Hello world!!")))
            {
                // ...
            }
        }
        //! [sp_heter_queue try_reentrant_push example 1]

        //! [sp_heter_queue try_reentrant_emplace example 1]
        if (queue.template try_reentrant_emplace<int>(progress_blocking))
        {
            if (queue.template try_reentrant_emplace<std::string>(progress_blocking, 12, '-'))
            {
                // ...
            }
        }
        //! [sp_heter_queue try_reentrant_emplace example 1]

        {
            //! [sp_heter_queue try_start_reentrant_push example 1]
            if (auto put = queue.try_start_reentrant_push(progress_blocking, 12))
            {
                // ...
                put.element() += 2;
                put.commit(); // commits a 14
            }
            //! [sp_heter_queue try_start_reentrant_push example 1]
        }
        {
            //! [sp_heter_queue try_start_reentrant_emplace example 1]
            if (
              auto put =
                queue.template try_start_reentrant_emplace<std::string>(progress_blocking, 4, '*'))
            {
                // ...
                put.element() += "****";
                put.commit(); // commits a "********"
            }
            //! [sp_heter_queue try_start_reentrant_emplace example 1]
        }
    }
    {
        //! [sp_heter_queue try_reentrant_dyn_push example 1]
        using MyRunTimeType = runtime_type<f_default_construct, f_destroy, f_size, f_alignment>;
        sp_heter_queue<MyRunTimeType> queue;

        auto const type = MyRunTimeType::make<int>();
        if (queue.try_reentrant_dyn_push(progress_blocking, type)) // appends 0
        {
            // ...
        }
        //! [sp_heter_queue try_reentrant_dyn_push example 1]
    }
    {
        //! [sp_heter_queue try_reentrant_dyn_push_copy example 1]
        using MyRunTimeType = runtime_type<f_copy_construct, f_destroy, f_size, f_alignment>;
        sp_heter_queue<MyRunTimeType> queue;

        std::string const source("Hello world!!");
        auto const        type = MyRunTimeType::make<decltype(source)>();
        if (queue.try_reentrant_dyn_push_copy(progress_blocking, type, &source))
        {
            // ...
        }
        //! [sp_heter_queue try_reentrant_dyn_push_copy example 1]
    }
    {
        //! [sp_heter_queue try_reentrant_dyn_push_move example 1]
        using MyRunTimeType = runtime_type<f_move_construct, f_destroy, f_size, f_alignment>;
        sp_heter_queue<MyRunTimeType> queue;

        std::string source("Hello world!!");
        auto const  type = MyRunTimeType::make<decltype(source)>();
        if (queue.try_reentrant_dyn_push_move(progress_blocking, type, &source))
        {
            // ...
        }
        //! [sp_heter_queue try_reentrant_dyn_push_move example 1]
    }

    {
        //! [sp_heter_queue try_start_reentrant_dyn_push example 1]
        using MyRunTimeType = runtime_type<f_default_construct, f_destroy, f_size, f_alignment>;
        sp_heter_queue<MyRunTimeType> queue;

        auto const type = MyRunTimeType::make<int>();
        if (auto put = queue.try_start_reentrant_dyn_push(progress_blocking, type))
        {
            // ...
            put.commit();
        }
        //! [sp_heter_queue try_start_reentrant_dyn_push example 1]
    }
    {
        //! [sp_heter_queue try_start_reentrant_dyn_push_copy example 1]
        using MyRunTimeType = runtime_type<f_copy_construct, f_destroy, f_size, f_alignment>;
        sp_heter_queue<MyRunTimeType> queue;

        std::string const source("Hello world!!");
        auto const        type = MyRunTimeType::make<decltype(source)>();
        if (auto put = queue.try_start_reentrant_dyn_push_copy(progress_blocking, type, &source))
        {
            // ...
            put.commit();
        }
        //! [sp_heter_queue try_start_reentrant_dyn_push_copy example 1]
    }
    {
        //! [sp_heter_queue try_start_reentrant_dyn_push_move example 1]
        using MyRunTimeType = runtime_type<f_move_construct, f_destroy, f_size, f_alignment>;
        sp_heter_queue<MyRunTimeType> queue;

        std::string source("Hello world!!");
        auto const  type = MyRunTimeType::make<decltype(source)>();
        if (auto put = queue.try_start_reentrant_dyn_push_move(progress_blocking, type, &source))
        {
            // ...
            put.commit();
        }
        //! [sp_heter_queue try_start_reentrant_dyn_push_move example 1]
    }
}